

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

bool __thiscall crunch::parse_mipmap_params(crunch *this,crn_mipmap_params *mip_params)

{
  bool bVar1;
  crn_uint32 cVar2;
  char *pcVar3;
  uint32 i;
  crn_mip_mode m;
  crn_mip_filter f;
  command_line_params *this_00;
  float fVar4;
  dynamic_string val;
  dynamic_string local_40;
  
  val.m_buf_size = 0;
  val.m_len = 0;
  val.m_pStr = (char *)0x0;
  this_00 = &this->m_params;
  bVar1 = crnlib::command_line_params::get_value_as_string(this_00,"mipMode",0,&val,0);
  if (bVar1) {
    for (m = cCRNMipModeUseSourceOrGenerateMips; m != cCRNMipModeTotal;
        m = m + cCRNMipModeUseSourceMips) {
      pcVar3 = crn_get_mip_mode_name(m);
      bVar1 = crnlib::dynamic_string::operator==(&val,pcVar3);
      if (bVar1) {
        mip_params->m_mode = m;
        goto LAB_0010b87c;
      }
    }
    pcVar3 = "";
    if (val.m_pStr != (char *)0x0) {
      pcVar3 = val.m_pStr;
    }
    bVar1 = false;
    crnlib::console::error("Invalid MipMode: \"%s\"",pcVar3);
  }
  else {
LAB_0010b87c:
    bVar1 = crnlib::command_line_params::get_value_as_string(this_00,"mipFilter",0,&val,0);
    if (bVar1) {
      for (f = cCRNMipFilterBox; f != cCRNMipFilterTotal; f = f + cCRNMipFilterTent) {
        pcVar3 = crn_get_mip_filter_name(f);
        crnlib::dynamic_string::dynamic_string(&local_40,pcVar3);
        bVar1 = crnlib::dynamic_string::operator==(&val,&local_40);
        crnlib::dynamic_string::~dynamic_string(&local_40);
        if (bVar1) {
          mip_params->m_filter = f;
          if (f == cCRNMipFilterBox) {
            mip_params->m_blurriness = 1.0;
          }
          goto LAB_0010b911;
        }
      }
      pcVar3 = "";
      if (val.m_pStr != (char *)0x0) {
        pcVar3 = val.m_pStr;
      }
      bVar1 = false;
      crnlib::console::error("Invalid MipFilter: \"%s\"",pcVar3);
    }
    else {
LAB_0010b911:
      fVar4 = crnlib::command_line_params::get_value_as_float
                        (this_00,"gamma",0,mip_params->m_gamma,0.1,8.0,0);
      mip_params->m_gamma = fVar4;
      mip_params->m_gamma_filtering = -(uint)(fVar4 != 1.0) & 1;
      fVar4 = crnlib::command_line_params::get_value_as_float
                        (this_00,"blurriness",0,mip_params->m_blurriness,0.01,8.0,0);
      mip_params->m_blurriness = fVar4;
      bVar1 = crnlib::command_line_params::get_value_as_bool
                        (this_00,"renormalize",0,mip_params->m_renormalize != 0);
      mip_params->m_renormalize = (uint)bVar1;
      bVar1 = crnlib::command_line_params::get_value_as_bool
                        (this_00,"rtopmip",0,mip_params->m_rtopmip != 0);
      mip_params->m_rtopmip = (uint)bVar1;
      bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"wrap",0,false);
      mip_params->m_tiled = (uint)bVar1;
      cVar2 = crnlib::command_line_params::get_value_as_int(this_00,"maxmips",0,0x10,1,0x10,0);
      mip_params->m_max_levels = cVar2;
      cVar2 = crnlib::command_line_params::get_value_as_int(this_00,"minmipsize",0,1,1,0x1000,0);
      mip_params->m_min_mip_size = cVar2;
      bVar1 = true;
    }
  }
  crnlib::dynamic_string::~dynamic_string(&val);
  return bVar1;
}

Assistant:

bool parse_mipmap_params(crn_mipmap_params& mip_params)
    {
        dynamic_string val;

        if (m_params.get_value_as_string("mipMode", 0, val))
        {
            uint32 i;
            for (i = 0; i < cCRNMipModeTotal; i++)
            {
                if (val == crn_get_mip_mode_name(static_cast<crn_mip_mode>(i)))
                {
                    mip_params.m_mode = static_cast<crn_mip_mode>(i);
                    break;
                }
            }
            if (i == cCRNMipModeTotal)
            {
                console::error("Invalid MipMode: \"%s\"", val.get_ptr());
                return false;
            }
        }

        if (m_params.get_value_as_string("mipFilter", 0, val))
        {
            uint32 i;
            for (i = 0; i < cCRNMipFilterTotal; i++)
            {
                if (val == dynamic_string(crn_get_mip_filter_name(static_cast<crn_mip_filter>(i))))
                {
                    mip_params.m_filter = static_cast<crn_mip_filter>(i);
                    break;
                }
            }

            if (i == cCRNMipFilterTotal)
            {
                console::error("Invalid MipFilter: \"%s\"", val.get_ptr());
                return false;
            }

            if (i == cCRNMipFilterBox)
            {
                mip_params.m_blurriness = 1.0f;
            }
        }

        mip_params.m_gamma = m_params.get_value_as_float("gamma", 0, mip_params.m_gamma, .1f, 8.0f);
        mip_params.m_gamma_filtering = (mip_params.m_gamma != 1.0f);

        mip_params.m_blurriness = m_params.get_value_as_float("blurriness", 0, mip_params.m_blurriness, .01f, 8.0f);

        mip_params.m_renormalize = m_params.get_value_as_bool("renormalize", 0, mip_params.m_renormalize != 0);
        mip_params.m_rtopmip = m_params.get_value_as_bool("rtopmip", 0, mip_params.m_rtopmip != 0);
        mip_params.m_tiled = m_params.get_value_as_bool("wrap");

        mip_params.m_max_levels = m_params.get_value_as_int("maxmips", 0, cCRNMaxLevels, 1, cCRNMaxLevels);
        mip_params.m_min_mip_size = m_params.get_value_as_int("minmipsize", 0, 1, 1, cCRNMaxLevelResolution);

        return true;
    }